

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O3

void __thiscall Cmd::Cmd(Cmd *this,string *history_file,FILE *in,FILE *out)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  int iVar3;
  
  (this->prompt)._M_dataplus._M_p = (pointer)&(this->prompt).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)this,"(Cmd) ","");
  this->multiline_mode = false;
  this->raw_mode_ = false;
  this->in_ = in;
  this->out_ = out;
  this->complete_key_ = 9;
  this->in_fd_ = 0;
  this->out_fd_ = 1;
  p_Var1 = &(this->commands_)._M_t._M_impl.super__Rb_tree_header;
  (this->commands_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->commands_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->commands_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->commands_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->history_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->history_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->history_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->commands_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->hints_handler_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->hints_handler_).super__Function_base._M_functor + 8) = 0;
  (this->hints_handler_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->hints_handler_)._M_invoker = (_Invoker_type)0x0;
  (this->history_file_).
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p =
       (pointer)((long)&(this->history_file_).
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload + 0x10);
  pcVar2 = (history_file->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->history_file_,pcVar2,pcVar2 + history_file->_M_string_length);
  (this->history_file_).
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = true;
  iVar3 = fileno((FILE *)this->in_);
  this->in_fd_ = iVar3;
  iVar3 = fileno((FILE *)this->out_);
  this->out_fd_ = iVar3;
  loadHistory(this);
  return;
}

Assistant:

explicit Cmd(const std::string &history_file, FILE *in = stdin, FILE *out = stdout)
		: in_(in), out_(out), history_file_(history_file) {

		in_fd_  = fileno(in_);
		out_fd_ = fileno(out_);

		loadHistory();
	}